

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeCloseStatement(Vdbe *p,int eOp)

{
  sqlite3 *db;
  Btree *p_00;
  i64 iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iSavepoint;
  
  db = p->db;
  if (db->nStatement == 0) {
    return 0;
  }
  if (p->iStatement == 0) {
    return 0;
  }
  iSavepoint = p->iStatement + -1;
  lVar4 = 8;
  iVar3 = 0;
  for (lVar5 = 0; lVar5 < db->nDb; lVar5 = lVar5 + 1) {
    p_00 = *(Btree **)((long)&db->aDb->zName + lVar4);
    if (p_00 != (Btree *)0x0) {
      if ((eOp != 2) || (iVar2 = sqlite3BtreeSavepoint(p_00,2,iSavepoint), iVar2 == 0)) {
        iVar2 = sqlite3BtreeSavepoint(p_00,1,iSavepoint);
      }
      if (iVar3 == 0) {
        iVar3 = iVar2;
      }
    }
    lVar4 = lVar4 + 0x20;
  }
  db->nStatement = db->nStatement + -1;
  p->iStatement = 0;
  if (iVar3 == 0) {
    if ((eOp == 2) && (iVar3 = sqlite3VtabSavepoint(db,2,iSavepoint), iVar3 != 0))
    goto LAB_001256d2;
    iVar3 = sqlite3VtabSavepoint(db,1,iSavepoint);
  }
  if (eOp != 2) {
    return iVar3;
  }
LAB_001256d2:
  iVar1 = p->nStmtDefImmCons;
  db->nDeferredCons = p->nStmtDefCons;
  db->nDeferredImmCons = iVar1;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCloseStatement(Vdbe *p, int eOp){
  sqlite3 *const db = p->db;
  int rc = SQLITE_OK;

  /* If p->iStatement is greater than zero, then this Vdbe opened a 
  ** statement transaction that should be closed here. The only exception
  ** is that an IO error may have occurred, causing an emergency rollback.
  ** In this case (db->nStatement==0), and there is nothing to do.
  */
  if( db->nStatement && p->iStatement ){
    int i;
    const int iSavepoint = p->iStatement-1;

    assert( eOp==SAVEPOINT_ROLLBACK || eOp==SAVEPOINT_RELEASE);
    assert( db->nStatement>0 );
    assert( p->iStatement==(db->nStatement+db->nSavepoint) );

    for(i=0; i<db->nDb; i++){ 
      int rc2 = SQLITE_OK;
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        if( eOp==SAVEPOINT_ROLLBACK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_ROLLBACK, iSavepoint);
        }
        if( rc2==SQLITE_OK ){
          rc2 = sqlite3BtreeSavepoint(pBt, SAVEPOINT_RELEASE, iSavepoint);
        }
        if( rc==SQLITE_OK ){
          rc = rc2;
        }
      }
    }
    db->nStatement--;
    p->iStatement = 0;

    if( rc==SQLITE_OK ){
      if( eOp==SAVEPOINT_ROLLBACK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_ROLLBACK, iSavepoint);
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3VtabSavepoint(db, SAVEPOINT_RELEASE, iSavepoint);
      }
    }

    /* If the statement transaction is being rolled back, also restore the 
    ** database handles deferred constraint counter to the value it had when 
    ** the statement transaction was opened.  */
    if( eOp==SAVEPOINT_ROLLBACK ){
      db->nDeferredCons = p->nStmtDefCons;
      db->nDeferredImmCons = p->nStmtDefImmCons;
    }
  }
  return rc;
}